

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O0

string * benchmark::ExponentToPrefix_abi_cxx11_(int64_t exponent,bool iec)

{
  byte in_DL;
  long in_RSI;
  string *in_RDI;
  char *array;
  int64_t index;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff48;
  char cVar2;
  allocator *paVar1;
  undefined1 *local_a0;
  undefined1 *local_98;
  long local_88;
  allocator local_62;
  allocator local_61;
  string local_60 [32];
  undefined1 *local_40;
  allocator local_31;
  long local_30;
  allocator local_12;
  byte local_11;
  
  cVar2 = (char)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  local_11 = in_DL & 1;
  if (in_RSI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_12);
    std::allocator<char>::~allocator((allocator<char> *)&local_12);
  }
  else {
    if (in_RSI < 1) {
      local_88 = -1 - in_RSI;
    }
    else {
      local_88 = in_RSI + -1;
    }
    local_30 = local_88;
    if (local_88 < 9) {
      if (in_RSI < 1) {
        local_a0 = (anonymous_namespace)::kSmallSIUnits;
      }
      else {
        if (local_11 == 0) {
          local_98 = (anonymous_namespace)::kBigSIUnits;
        }
        else {
          local_98 = (anonymous_namespace)::kBigIECUnits;
        }
        local_a0 = local_98;
      }
      local_40 = local_a0;
      if (local_11 == 0) {
        cVar2 = local_a0[local_88];
        paVar1 = &local_62;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)in_RDI,1,cVar2,paVar1);
        std::allocator<char>::~allocator((allocator<char> *)&local_62);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_60,"i",&local_61);
        std::operator+(cVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        std::__cxx11::string::~string(local_60);
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",&local_31);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
    }
  }
  return in_RDI;
}

Assistant:

std::string ExponentToPrefix(int64_t exponent, bool iec) {
  if (exponent == 0) return "";

  const int64_t index = (exponent > 0 ? exponent - 1 : -exponent - 1);
  if (index >= kUnitsSize) return "";

  const char* array =
      (exponent > 0 ? (iec ? kBigIECUnits : kBigSIUnits) : kSmallSIUnits);
  if (iec)
    return array[index] + std::string("i");
  else
    return std::string(1, array[index]);
}